

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  FieldMetadata *md;
  bool bVar1;
  uint8 *field;
  uint8 *ptr;
  FieldMetadata *field_metadata;
  int i;
  SpecialSerializer func;
  CodedOutputStream *output_local;
  int32 num_fields_local;
  FieldMetadata *field_metadata_table_local;
  uint8 *base_local;
  
  for (field_metadata._4_4_ = 0; field_metadata._4_4_ < num_fields;
      field_metadata._4_4_ = field_metadata._4_4_ + 1) {
    md = field_metadata_table + field_metadata._4_4_;
    field = base + md->offset;
    switch(md->type) {
    case 0:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 1:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 2:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 3:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 4:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 5:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 6:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 7:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 8:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 9:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 10:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0xb:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0xc:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0xd:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0xe:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0xf:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x10:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x11:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    default:
      SerializeNotImplemented(md->type);
      break;
    case 0x14:
      bVar1 = IsNull<1>(field);
      if (!bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x15:
      bVar1 = IsNull<2>(field);
      if (!bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x16:
      bVar1 = IsNull<3>(field);
      if (!bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x17:
      bVar1 = IsNull<4>(field);
      if (!bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x18:
      bVar1 = IsNull<5>(field);
      if (!bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x19:
      bVar1 = IsNull<6>(field);
      if (!bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x1a:
      bVar1 = IsNull<7>(field);
      if (!bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x1b:
      bVar1 = IsNull<8>(field);
      if (!bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x1c:
      bVar1 = IsNull<9>(field);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x1d:
      bVar1 = IsNull<10>(field);
      if (!bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x1e:
      bVar1 = IsNull<11>(field);
      if (!bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x1f:
      bVar1 = IsNull<12>(field);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x20:
      bVar1 = IsNull<13>(field);
      if (!bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x21:
      bVar1 = IsNull<14>(field);
      if (!bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x22:
      bVar1 = IsNull<15>(field);
      if (!bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x23:
      bVar1 = IsNull<16>(field);
      if (!bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x24:
      bVar1 = IsNull<17>(field);
      if (!bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x25:
      bVar1 = IsNull<18>(field);
      if (!bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output)
        ;
      }
      break;
    case 0x28:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x29:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x2a:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x2b:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x2c:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x2d:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x2e:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x2f:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x30:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x31:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x32:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x33:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x34:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x35:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x36:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x37:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x38:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x39:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x3c:
      PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x3d:
      PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x3e:
      PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x3f:
      PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x40:
      PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x41:
      PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x42:
      PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x43:
      PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x44:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x45:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x46:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x48:
      PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x49:
      PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x4a:
      PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x4b:
      PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x4c:
      PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x4d:
      PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      break;
    case 0x50:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x51:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x52:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x53:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x54:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x55:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x56:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x57:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x58:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x59:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x5a:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x5b:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<12>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x5c:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x5d:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x5e:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x5f:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x60:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 0x61:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>(field,md,output);
      }
      break;
    case 100:
      (*(code *)md->ptr)(base,md->offset,md->tag,md->has_offset,output);
    }
  }
  return;
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}